

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

void s16_setvol(void *ptr,long nsamp,float volume)

{
  int32_t s;
  int32_t mult;
  int16_t *dst;
  float volume_local;
  long nsamp_local;
  void *ptr_local;
  
  dst = (int16_t *)ptr;
  nsamp_local = nsamp;
  while (0 < nsamp_local) {
    *dst = (int16_t)((int)*dst * (int)(volume * 32768.0) >> 0xf);
    dst = dst + 1;
    nsamp_local = nsamp_local + -1;
  }
  return;
}

Assistant:

static void
s16_setvol(void * ptr, long nsamp, float volume)
{
  int16_t * dst = ptr;
  int32_t mult = volume * 32768;
  int32_t s;

  while (nsamp-- > 0) {
    s = *dst;
    s = (s * mult) >> 15;
    *(dst++) = s;
  }
}